

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::BuildLocalStackingContext(Element *this)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  Vector<StackingContextChild> stacking_children;
  Vector<StackingContextChild> local_48;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>,_Rml::StackingContextChild>
  local_30;
  
  this->stacking_context_dirty = false;
  local_48.super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
  ._M_impl.super__Vector_impl_data._M_start = (StackingContextChild *)0x0;
  local_48.super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
  ._M_impl.super__Vector_impl_data._M_finish = (StackingContextChild *)0x0;
  local_48.super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AddChildrenToStackingContext(this,&local_48);
  pSVar2 = local_48.
           super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar1 = local_48.
           super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = (long)local_48.
                  super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    ::std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>,_Rml::StackingContextChild>
    ::_Temporary_buffer(&local_30,
                        (__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>
                         )local_48.
                          super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
    if (local_30._M_buffer == (pointer)0x0) {
      ::std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar1,pSVar2);
    }
    else {
      ::std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,Rml::StackingContextChild*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar1,pSVar2);
    }
    operator_delete(local_30._M_buffer,local_30._M_len << 4);
  }
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
            (&this->stacking_context,
             (long)local_48.
                   super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_48.
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      (this->stacking_context).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar4] =
           *(Element **)
            ((long)&(local_48.
                     super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                     ._M_impl.super__Vector_impl_data._M_start)->element + lVar3);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)local_48.
                                   super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_48.
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>.
      _M_impl.super__Vector_impl_data._M_start != (StackingContextChild *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Element::BuildLocalStackingContext()
{
	stacking_context_dirty = false;

	Vector<StackingContextChild> stacking_children;
	AddChildrenToStackingContext(stacking_children);
	std::stable_sort(stacking_children.begin(), stacking_children.end());

	stacking_context.resize(stacking_children.size());
	for (size_t i = 0; i < stacking_children.size(); i++)
		stacking_context[i] = stacking_children[i].element;
}